

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

wchar_t archive_filter_b64encode_close(archive_write_filter *f)

{
  wchar_t wVar1;
  wchar_t wVar2;
  archive *in_RDI;
  wchar_t ret2;
  wchar_t ret;
  private_b64encode *state;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *buff;
  
  buff = (in_RDI->error_string).s;
  if (*(long *)(buff + 0x40) != 0) {
    b64_encode(_ret2,(uchar *)in_RDI,(size_t)buff);
  }
  archive_string_sprintf((archive_string *)(buff + 0x20),"====\n");
  archive_write_set_bytes_in_last_block(in_RDI,(int)((ulong)buff >> 0x20));
  wVar1 = __archive_write_filter
                    ((archive_write_filter *)in_RDI,buff,
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  wVar2 = __archive_write_close_filter
                    ((archive_write_filter *)CONCAT44(wVar1,in_stack_ffffffffffffffe8));
  if (wVar2 < wVar1) {
    wVar1 = wVar2;
  }
  return wVar1;
}

Assistant:

static int
archive_filter_b64encode_close(struct archive_write_filter *f)
{
	struct private_b64encode *state = (struct private_b64encode *)f->data;
	int ret, ret2;

	/* Flush remaining bytes. */
	if (state->hold_len != 0)
		b64_encode(&state->encoded_buff, state->hold, state->hold_len);
	archive_string_sprintf(&state->encoded_buff, "====\n");
	/* Write the last block */
	archive_write_set_bytes_in_last_block(f->archive, 1);
	ret = __archive_write_filter(f->next_filter,
	    state->encoded_buff.s, archive_strlen(&state->encoded_buff));
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	return (ret);
}